

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenType BinaryenArrayTypeGetElementType(BinaryenHeapType heapType)

{
  HeapTypeKind HVar1;
  HeapType local_28 [2];
  HeapType local_18;
  HeapType ht;
  
  local_18.id = heapType;
  HVar1 = wasm::HeapType::getKind(&local_18);
  if (HVar1 == Array) {
    wasm::HeapType::getArray(local_28);
    return local_28[0].id;
  }
  __assert_fail("ht.isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x161,"BinaryenType BinaryenArrayTypeGetElementType(BinaryenHeapType)");
}

Assistant:

BinaryenType BinaryenArrayTypeGetElementType(BinaryenHeapType heapType) {
  auto ht = HeapType(heapType);
  assert(ht.isArray());
  return ht.getArray().element.type.getID();
}